

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O0

int __thiscall UnifiedRegex::OctoquadIdentifier::GetOrAddCharCode(OctoquadIdentifier *this,Char c)

{
  int local_20;
  int i;
  Char c_local;
  OctoquadIdentifier *this_local;
  
  if (((ushort)c < 0x41) || (0x5a < (ushort)c)) {
    this_local._4_4_ = -1;
  }
  else {
    for (local_20 = 0; local_20 < this->numCodes; local_20 = local_20 + 1) {
      if ((*this->codeToChar)[local_20] == (char)c) {
        return local_20;
      }
    }
    if (this->numCodes == 4) {
      this_local._4_4_ = -1;
    }
    else {
      (*this->codeToChar)[this->numCodes] = (char)c;
      (*this->charToCode)[(ushort)c] = (char)this->numCodes;
      this_local._4_4_ = this->numCodes;
      this->numCodes = this_local._4_4_ + 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int OctoquadIdentifier::GetOrAddCharCode(const Char c)
    {
        if (c >= static_cast<Char>('A') && c <= static_cast<Char>('Z'))
        {
            for (int i = 0; i < numCodes; i++)
            {
                if (codeToChar[i] == static_cast<char>(c))
                    return i;
            }
            if (numCodes == TrigramAlphabet::AlphaCount)
                return -1;
            codeToChar[numCodes] = static_cast<char>(c);
            charToCode[c] = static_cast<char>(numCodes);
            return numCodes++;
        }
        else
            return -1;
    }